

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexicon.cpp
# Opt level: O0

int __thiscall Lexico::PosicaoIndice(Lexico *this,char ch)

{
  int iVar1;
  int local_20;
  int i;
  char ch_local;
  Lexico *this_local;
  
  local_20 = 2;
  while( true ) {
    if (0x22 < local_20) {
      iVar1 = isalpha((int)ch);
      if (iVar1 == 0) {
        iVar1 = isdigit((int)ch);
        if (iVar1 == 0) {
          this_local._4_4_ = -1;
        }
        else {
          this_local._4_4_ = 1;
        }
      }
      else {
        this_local._4_4_ = 0;
      }
      return this_local._4_4_;
    }
    if (ch == this->indice[local_20]) break;
    local_20 = local_20 + 1;
  }
  return local_20;
}

Assistant:

int Lexico::PosicaoIndice (char ch) {
  int i = 2;
  while (i < alfabeto) {
    if (ch == indice[i])
      return i;
    i++;
  }
  if (isalpha(ch))
    return 0;
  if (isdigit(ch))
    return 1;
  return -1;
}